

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineLayoutVk.cpp
# Opt level: O1

void __thiscall
Diligent::PipelineLayoutVk::Create
          (PipelineLayoutVk *this,RenderDeviceVkImpl *pDeviceVk,
          RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl> *ppSignatures,
          Uint32 SignatureCount)

{
  byte bVar1;
  uint uVar2;
  PipelineResourceSignatureVkImpl *pPVar3;
  VkDescriptorSetLayout_T *pVVar4;
  VulkanPhysicalDevice *pVVar5;
  uint uVar6;
  undefined4 in_register_0000000c;
  char (*Args_1) [50];
  long lVar7;
  Uint32 UVar8;
  ulong uVar9;
  char (*in_R8) [42];
  ulong uVar10;
  Uint32 DescSetLayoutCount;
  Uint32 DynamicStorageBufferCount;
  Uint32 DynamicUniformBufferCount;
  VkPipelineLayoutCreateInfo PipelineLayoutCI;
  array<VkDescriptorSetLayout_T_*,_16UL> DescSetLayouts;
  PipelineLayoutWrapper local_48;
  
  Args_1 = (char (*) [50])CONCAT44(in_register_0000000c,SignatureCount);
  if ((this->m_DescrSetCount != '\0') ||
     ((this->m_VkPipelineLayout).m_VkObject != (VkPipelineLayout_T *)0x0)) {
    FormatString<char[44]>
              ((string *)&DescSetLayouts,
               (char (*) [44])"This pipeline layout is already initialized");
    Args_1 = (char (*) [50])0x40;
    DebugAssertionFailed
              ((Char *)DescSetLayouts._M_elems[0],"Create",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineLayoutVk.cpp"
               ,0x40);
    if (DescSetLayouts._M_elems[0] != (VkDescriptorSetLayout_T *)(DescSetLayouts._M_elems + 2)) {
      operator_delete(DescSetLayouts._M_elems[0],(ulong)(DescSetLayouts._M_elems[2] + 1));
    }
  }
  DescSetLayoutCount = 0;
  DynamicUniformBufferCount = 0;
  DynamicStorageBufferCount = 0;
  if (SignatureCount != 0) {
    uVar10 = 0;
    do {
      if (ppSignatures[uVar10].m_pObject != (PipelineResourceSignatureVkImpl *)0x0) {
        if (0xff < DescSetLayoutCount) {
          FormatString<char[30],unsigned_int,char[42]>
                    ((string *)&PipelineLayoutCI,(Diligent *)"Descriptor set layout count (",
                     (char (*) [30])&DescSetLayoutCount,
                     (uint *)") exceeds the maximum representable value",in_R8);
          DebugAssertionFailed
                    ((Char *)PipelineLayoutCI._0_8_,"Create",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineLayoutVk.cpp"
                     ,0x50);
          if ((VkPipelineLayoutCreateFlags *)PipelineLayoutCI._0_8_ != &PipelineLayoutCI.flags) {
            operator_delete((void *)PipelineLayoutCI._0_8_,PipelineLayoutCI._16_8_ + 1);
          }
        }
        (this->m_FirstDescrSetIndex)._M_elems[uVar10] = (uchar)DescSetLayoutCount;
        PipelineLayoutCI.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
        PipelineLayoutCI._4_4_ = 0;
        PipelineLayoutCI.pNext = (void *)0x1;
        pPVar3 = ppSignatures[uVar10].m_pObject;
        lVar7 = 0;
        UVar8 = DescSetLayoutCount;
        do {
          pVVar4 = (pPVar3->m_VkDescrSetLayouts)._M_elems
                   [*(long *)((long)&PipelineLayoutCI.sType + lVar7)].m_VkObject;
          if (pVVar4 != (VkDescriptorSetLayout_T *)0x0) {
            uVar9 = (ulong)UVar8;
            UVar8 = UVar8 + 1;
            DescSetLayouts._M_elems[uVar9] = pVVar4;
            DescSetLayoutCount = UVar8;
          }
          lVar7 = lVar7 + 8;
        } while (lVar7 != 0x10);
        pPVar3 = ppSignatures[uVar10].m_pObject;
        DynamicUniformBufferCount = DynamicUniformBufferCount + pPVar3->m_DynamicUniformBufferCount;
        DynamicStorageBufferCount = DynamicStorageBufferCount + pPVar3->m_DynamicStorageBufferCount;
        bVar1 = (pPVar3->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>).
                super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                .m_Desc.BindingIndex;
        uVar2 = this->m_DbgMaxBindIndex;
        Args_1 = (char (*) [50])(ulong)uVar2;
        uVar6 = (uint)bVar1;
        if (bVar1 < uVar2) {
          uVar6 = uVar2;
        }
        this->m_DbgMaxBindIndex = uVar6;
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 != SignatureCount);
  }
  if (0x10 < DescSetLayoutCount) {
    FormatString<char[26],char[50]>
              ((string *)&PipelineLayoutCI,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"DescSetLayoutCount <= MAX_RESOURCE_SIGNATURES * 2",Args_1);
    DebugAssertionFailed
              ((Char *)PipelineLayoutCI._0_8_,"Create",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineLayoutVk.cpp"
               ,0x5f);
    if ((VkPipelineLayoutCreateFlags *)PipelineLayoutCI._0_8_ != &PipelineLayoutCI.flags) {
      operator_delete((void *)PipelineLayoutCI._0_8_,PipelineLayoutCI._16_8_ + 1);
    }
  }
  pVVar5 = (pDeviceVk->m_PhysicalDevice)._M_t.
           super___uniq_ptr_impl<VulkanUtilities::VulkanPhysicalDevice,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
           ._M_t.
           super__Tuple_impl<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
           .super__Head_base<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_false>._M_head_impl;
  if (*(uint32_t *)((long)&(pVVar5->m_Properties).limits + 0x40) < DescSetLayoutCount) {
    LogError<true,char[38],unsigned_int,char[53],unsigned_int,char[2]>
              (false,"Create",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineLayoutVk.cpp"
               ,0x65,(char (*) [38])"The total number of descriptor sets (",&DescSetLayoutCount,
               (char (*) [53])") used by the pipeline layout exceeds device limit (",
               (uint32_t *)((long)&(pVVar5->m_Properties).limits + 0x40),(char (*) [2])0x752f31);
  }
  if (*(uint32_t *)((long)&(pVVar5->m_Properties).limits + 0x68) < DynamicUniformBufferCount) {
    LogError<true,char[41],unsigned_int,char[53],unsigned_int,char[2]>
              (false,"Create",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineLayoutVk.cpp"
               ,0x6b,(char (*) [41])"The number of dynamic uniform buffers  (",
               &DynamicUniformBufferCount,
               (char (*) [53])") used by the pipeline layout exceeds device limit (",
               (uint32_t *)((long)&(pVVar5->m_Properties).limits + 0x68),(char (*) [2])0x752f31);
  }
  if (*(uint32_t *)((long)&(pVVar5->m_Properties).limits + 0x70) < DynamicStorageBufferCount) {
    LogError<true,char[40],unsigned_int,char[53],unsigned_int,char[2]>
              (false,"Create",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineLayoutVk.cpp"
               ,0x71,(char (*) [40])"The number of dynamic storage buffers (",
               &DynamicStorageBufferCount,
               (char (*) [53])") used by the pipeline layout exceeds device limit (",
               (uint32_t *)((long)&(pVVar5->m_Properties).limits + 0x70),(char (*) [2])0x752f31);
  }
  PipelineLayoutCI.sType = VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO;
  PipelineLayoutCI._4_4_ = 0;
  PipelineLayoutCI.pNext = (void *)0x0;
  PipelineLayoutCI._16_8_ = (ulong)DescSetLayoutCount << 0x20;
  PipelineLayoutCI.pSetLayouts = DescSetLayouts._M_elems;
  if (DescSetLayoutCount == 0) {
    PipelineLayoutCI.pSetLayouts = ((array<VkDescriptorSetLayout_T_*,_16UL> *)0x0)->_M_elems;
  }
  PipelineLayoutCI.pushConstantRangeCount = 0;
  PipelineLayoutCI._36_4_ = 0;
  PipelineLayoutCI.pPushConstantRanges = (VkPushConstantRange *)0x0;
  VulkanUtilities::VulkanLogicalDevice::CreatePipelineLayout
            (&local_48,
             (pDeviceVk->m_LogicalVkDevice).
             super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,&PipelineLayoutCI,"");
  VulkanUtilities::
  VulkanObjectWrapper<VkPipelineLayout_T_*,_(VulkanUtilities::VulkanHandleTypeId)11>::operator=
            (&this->m_VkPipelineLayout,&local_48);
  VulkanUtilities::
  VulkanObjectWrapper<VkPipelineLayout_T_*,_(VulkanUtilities::VulkanHandleTypeId)11>::
  ~VulkanObjectWrapper(&local_48);
  this->m_DescrSetCount = (uchar)DescSetLayoutCount;
  return;
}

Assistant:

void PipelineLayoutVk::Create(RenderDeviceVkImpl* pDeviceVk, RefCntAutoPtr<PipelineResourceSignatureVkImpl> ppSignatures[], Uint32 SignatureCount) noexcept(false)
{
    VERIFY(m_DescrSetCount == 0 && !m_VkPipelineLayout, "This pipeline layout is already initialized");

    std::array<VkDescriptorSetLayout, MAX_RESOURCE_SIGNATURES * PipelineResourceSignatureVkImpl::MAX_DESCRIPTOR_SETS> DescSetLayouts;

    Uint32 DescSetLayoutCount        = 0;
    Uint32 DynamicUniformBufferCount = 0;
    Uint32 DynamicStorageBufferCount = 0;

    for (Uint32 BindInd = 0; BindInd < SignatureCount; ++BindInd)
    {
        // Signatures are arranged by binding index by PipelineStateBase::CopyResourceSignatures
        const auto& pSignature = ppSignatures[BindInd];
        if (pSignature == nullptr)
            continue;

        VERIFY(DescSetLayoutCount <= std::numeric_limits<FirstDescrSetIndexArrayType::value_type>::max(),
               "Descriptor set layout count (", DescSetLayoutCount, ") exceeds the maximum representable value");
        m_FirstDescrSetIndex[BindInd] = static_cast<FirstDescrSetIndexArrayType::value_type>(DescSetLayoutCount);

        for (auto SetId : {PipelineResourceSignatureVkImpl::DESCRIPTOR_SET_ID_STATIC_MUTABLE, PipelineResourceSignatureVkImpl::DESCRIPTOR_SET_ID_DYNAMIC})
        {
            if (pSignature->HasDescriptorSet(SetId))
                DescSetLayouts[DescSetLayoutCount++] = pSignature->GetVkDescriptorSetLayout(SetId);
        }

        DynamicUniformBufferCount += pSignature->GetDynamicUniformBufferCount();
        DynamicStorageBufferCount += pSignature->GetDynamicStorageBufferCount();
#ifdef DILIGENT_DEBUG
        m_DbgMaxBindIndex = std::max(m_DbgMaxBindIndex, Uint32{pSignature->GetDesc().BindingIndex});
#endif
    }
    VERIFY_EXPR(DescSetLayoutCount <= MAX_RESOURCE_SIGNATURES * 2);

    const auto& Limits = pDeviceVk->GetPhysicalDevice().GetProperties().limits;
    if (DescSetLayoutCount > Limits.maxBoundDescriptorSets)
    {
        LOG_ERROR_AND_THROW("The total number of descriptor sets (", DescSetLayoutCount,
                            ") used by the pipeline layout exceeds device limit (", Limits.maxBoundDescriptorSets, ")");
    }

    if (DynamicUniformBufferCount > Limits.maxDescriptorSetUniformBuffersDynamic)
    {
        LOG_ERROR_AND_THROW("The number of dynamic uniform buffers  (", DynamicUniformBufferCount,
                            ") used by the pipeline layout exceeds device limit (", Limits.maxDescriptorSetUniformBuffersDynamic, ")");
    }

    if (DynamicStorageBufferCount > Limits.maxDescriptorSetStorageBuffersDynamic)
    {
        LOG_ERROR_AND_THROW("The number of dynamic storage buffers (", DynamicStorageBufferCount,
                            ") used by the pipeline layout exceeds device limit (", Limits.maxDescriptorSetStorageBuffersDynamic, ")");
    }

    VERIFY(m_DescrSetCount <= std::numeric_limits<decltype(m_DescrSetCount)>::max(),
           "Descriptor set count (", DescSetLayoutCount, ") exceeds the maximum representable value");

    VkPipelineLayoutCreateInfo PipelineLayoutCI = {};

    PipelineLayoutCI.sType                  = VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO;
    PipelineLayoutCI.pNext                  = nullptr;
    PipelineLayoutCI.flags                  = 0; // reserved for future use
    PipelineLayoutCI.setLayoutCount         = DescSetLayoutCount;
    PipelineLayoutCI.pSetLayouts            = DescSetLayoutCount ? DescSetLayouts.data() : nullptr;
    PipelineLayoutCI.pushConstantRangeCount = 0;
    PipelineLayoutCI.pPushConstantRanges    = nullptr;
    m_VkPipelineLayout                      = pDeviceVk->GetLogicalDevice().CreatePipelineLayout(PipelineLayoutCI);

    m_DescrSetCount = static_cast<Uint8>(DescSetLayoutCount);
}